

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxHarrisRT<double>::maxDelta
          (SPxHarrisRT<double> *this,double *param_1,double *val,int num,int *idx,double *upd,
          double *vec,double *low,double *up)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  Real RVar5;
  ulong extraout_XMM0_Qb;
  double dVar6;
  double dVar7;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_58;
  double local_48;
  ulong uStack_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar5 = Tolerances::epsilon(local_58._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  local_48 = -RVar5;
  uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
  lVar4 = (long)num;
  dVar6 = *val;
  do {
    do {
      while( true ) {
        dVar7 = dVar6;
        lVar4 = lVar4 + -1;
        if (lVar4 == -1) {
          *val = dVar7;
          return -1;
        }
        iVar2 = idx[lVar4];
        dVar6 = upd[iVar2];
        if (dVar6 <= RVar5) break;
        dVar1 = up[iVar2];
        dVar6 = ((dVar1 - vec[iVar2]) + (this->super_SPxRatioTester<double>).delta) / dVar6;
        if ((dVar7 <= dVar6) || (pdVar3 = (double *)infinity(), *pdVar3 <= dVar1))
        goto LAB_001d1d02;
      }
      if (local_48 <= dVar6) break;
      dVar1 = low[iVar2];
      dVar6 = ((dVar1 - vec[iVar2]) - (this->super_SPxRatioTester<double>).delta) / dVar6;
    } while ((dVar6 < dVar7) && (pdVar3 = (double *)infinity(), -*pdVar3 < dVar1));
LAB_001d1d02:
    dVar6 = dVar7;
  } while( true );
}

Assistant:

int SPxHarrisRT<R>::maxDelta(
   R* /*max*/,             /* max abs value in upd */
   R* val,             /* initial and chosen value */
   int num,             /* # of indices in idx */
   const int* idx,             /* nonzero indices in upd */
   const R* upd,             /* update VectorBase<R> for vec */
   const R* vec,             /* current VectorBase<R> */
   const R* low,             /* lower bounds for vec */
   const R* up               /* upper bounds for vec */
)  const
{
   R x;
   R theval;
   /**@todo patch suggests using *max instead of themax */
   R themax;
   int sel;
   int i;
   R epsilon = this->tolerances()->epsilon();

   assert(*val >= 0);

   theval = *val;
   themax = 0;
   sel = -1;

   while(num--)
   {
      i = idx[num];
      x = upd[i];

      if(x > epsilon)
      {
         themax = (x > themax) ? x : themax;
         x = (up[i] - vec[i] + this->delta) / x;

         if(x < theval && up[i] < R(infinity))
            theval = x;
      }
      else if(x < -epsilon)
      {
         themax = (-x > themax) ? -x : themax;
         x = (low[i] - vec[i] - this->delta) / x;

         if(x < theval && low[i] > R(-infinity))
            theval = x;
      }
   }

   *val = theval;
   return sel;
}